

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameTriggerFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  uint uVar1;
  uchar *z;
  char *z_00;
  uchar *puVar2;
  ulong uVar3;
  int iVar4;
  int token;
  uchar *local_50;
  sqlite3_context *local_48;
  sqlite3 *local_40;
  uchar *local_38;
  
  local_48 = context;
  z = sqlite3_value_text(*argv);
  local_38 = sqlite3_value_text(argv[1]);
  if (z != (uchar *)0x0) {
    local_40 = local_48->pOut->db;
    iVar4 = 3;
    uVar1 = 0;
    local_50 = z;
    while (puVar2 = z, *puVar2 != '\0') {
      uVar3 = (ulong)uVar1;
      z = puVar2;
      do {
        z = z + (int)uVar1;
        uVar1 = sqlite3GetToken(z,&token);
      } while (token == 0xa3);
      iVar4 = iVar4 + 1;
      if (token == 0x6b) {
        iVar4 = 0;
      }
      if (token == 0x7a) {
        iVar4 = 0;
      }
      if ((iVar4 == 2) && (((token == 5 || (token == 0x89)) || (token == 0x2d)))) {
        z_00 = sqlite3MPrintf(local_40,"%.*s\"%w\"%s",(ulong)(uint)((int)puVar2 - (int)local_50),
                              local_50,local_38,puVar2 + uVar3);
        sqlite3_result_text(local_48,z_00,-1,sqlite3MallocSize);
        return;
      }
    }
  }
  return;
}

Assistant:

static void renameTriggerFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  unsigned char const *zSql = sqlite3_value_text(argv[0]);
  unsigned char const *zTableName = sqlite3_value_text(argv[1]);

  int token;
  Token tname;
  int dist = 3;
  unsigned char const *zCsr = zSql;
  int len = 0;
  char *zRet;
  sqlite3 *db = sqlite3_context_db_handle(context);

  UNUSED_PARAMETER(NotUsed);

  /* The principle used to locate the table name in the CREATE TRIGGER 
  ** statement is that the table name is the first token that is immediately
  ** preceded by either TK_ON or TK_DOT and immediately followed by one
  ** of TK_WHEN, TK_BEGIN or TK_FOR.
  */
  if( zSql ){
    do {

      if( !*zCsr ){
        /* Ran out of input before finding the table name. Return NULL. */
        return;
      }

      /* Store the token that zCsr points to in tname. */
      tname.z = (char*)zCsr;
      tname.n = len;

      /* Advance zCsr to the next token. Store that token type in 'token',
      ** and its length in 'len' (to be used next iteration of this loop).
      */
      do {
        zCsr += len;
        len = sqlite3GetToken(zCsr, &token);
      }while( token==TK_SPACE );
      assert( len>0 );

      /* Variable 'dist' stores the number of tokens read since the most
      ** recent TK_DOT or TK_ON. This means that when a WHEN, FOR or BEGIN 
      ** token is read and 'dist' equals 2, the condition stated above
      ** to be met.
      **
      ** Note that ON cannot be a database, table or column name, so
      ** there is no need to worry about syntax like 
      ** "CREATE TRIGGER ... ON ON.ON BEGIN ..." etc.
      */
      dist++;
      if( token==TK_DOT || token==TK_ON ){
        dist = 0;
      }
    } while( dist!=2 || (token!=TK_WHEN && token!=TK_FOR && token!=TK_BEGIN) );

    /* Variable tname now contains the token that is the old table-name
    ** in the CREATE TRIGGER statement.
    */
    zRet = sqlite3MPrintf(db, "%.*s\"%w\"%s", (int)(((u8*)tname.z) - zSql),
       zSql, zTableName, tname.z+tname.n);
    sqlite3_result_text(context, zRet, -1, SQLITE_DYNAMIC);
  }
}